

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 whereIsCoveringIndex(WhereInfo *pWInfo,Index *pIdx,int iTabCur)

{
  short *psVar1;
  uint uVar2;
  ulong uVar3;
  CoveringIndexCheck ck;
  Walker local_38;
  
  uVar2 = 1;
  if (pWInfo->pSelect != (Select *)0x0) {
    local_38.u.pNC = (NameContext *)&ck;
    uVar3 = 0;
    do {
      if (pIdx->nColumn == uVar3) {
        return 1;
      }
      psVar1 = pIdx->aiColumn + uVar3;
      uVar3 = uVar3 + 1;
    } while (*psVar1 < 0x3f);
    local_38.pParse = (Parse *)0x0;
    local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_38.walkerDepth = 0;
    local_38.eCode = 0;
    local_38._38_2_ = 0;
    local_38.xExprCallback = whereIsCoveringIndexWalkCallback;
    local_38.xSelectCallback = sqlite3SelectWalkNoop;
    ck.pIdx = pIdx;
    ck.iTabCur = iTabCur;
    sqlite3WalkSelect(&local_38,pWInfo->pSelect);
    uVar2 = (uint)local_38.eCode;
  }
  return uVar2;
}

Assistant:

static SQLITE_NOINLINE u32 whereIsCoveringIndex(
  WhereInfo *pWInfo,     /* The WHERE clause context */
  Index *pIdx,           /* Index that is being tested */
  int iTabCur            /* Cursor for the table being indexed */
){
  int i;
  struct CoveringIndexCheck ck;
  Walker w;
  if( pWInfo->pSelect==0 ){
    /* We don't have access to the full query, so we cannot check to see
    ** if pIdx is covering.  Assume it is not. */
    return 1;
  }
  for(i=0; i<pIdx->nColumn; i++){
    if( pIdx->aiColumn[i]>=BMS-1 ) break;
  }
  if( i>=pIdx->nColumn ){
    /* pIdx does not index any columns greater than 62, but we know from
    ** colMask that columns greater than 62 are used, so this is not a
    ** covering index */
    return 1;
  }
  ck.pIdx = pIdx;
  ck.iTabCur = iTabCur;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIsCoveringIndexWalkCallback;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pCovIdxCk = &ck;
  w.eCode = 0;
  sqlite3WalkSelect(&w, pWInfo->pSelect);
  return w.eCode;
}